

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O2

void hexdump(char *data,char *mask,size_t len)

{
  int j;
  long lVar1;
  long lVar2;
  char *pcVar3;
  char *pcVar4;
  uint uVar5;
  uint uVar6;
  int i;
  int iVar7;
  int __c;
  char *pcVar8;
  int local_58;
  
  uVar5 = 0;
  pcVar4 = mask;
  do {
    printf("#%07x: ",(ulong)uVar5);
    iVar7 = 0;
    pcVar3 = pcVar4;
    pcVar8 = data;
    uVar6 = uVar5;
    for (lVar2 = 0; local_58 = (int)len, lVar2 != 8; lVar2 = lVar2 + 1) {
      for (lVar1 = 0; lVar1 != 2; lVar1 = lVar1 + 1) {
        if (local_58 <= (int)(uVar6 + (int)lVar1)) goto LAB_00101721;
        if (mask == (char *)0x0) {
          printf("%02x",(ulong)(byte)pcVar8[lVar1]);
        }
        else {
          if (pcVar3[lVar1] != '\0') {
            printf("%s","\x1b[30;1m");
          }
          printf("%02x",(ulong)(byte)pcVar8[lVar1]);
          if ((mask != (char *)0x0) && (pcVar3[lVar1] != '\0')) {
            printf("%s","\x1b[0m");
          }
        }
        iVar7 = iVar7 + 2;
      }
      putchar(0x20);
      iVar7 = iVar7 + 1;
      pcVar8 = pcVar8 + 2;
      pcVar3 = pcVar3 + 2;
      uVar6 = uVar6 + 2;
    }
LAB_00101721:
    for (; iVar7 < 0x29; iVar7 = iVar7 + 1) {
      putchar(0x20);
    }
    for (lVar2 = 0; lVar2 != 0x10; lVar2 = lVar2 + 1) {
      __c = (int)data[lVar2];
      iVar7 = isprint(__c);
      if (iVar7 == 0) {
        __c = 0x2e;
      }
      putchar(__c);
    }
    putchar(10);
    uVar5 = uVar5 + 0x10;
    data = data + 0x10;
    pcVar4 = pcVar4 + 0x10;
    if (local_58 <= (int)uVar5) {
      return;
    }
  } while( true );
}

Assistant:

void hexdump(const char *data, const char *mask, size_t len)
{
    const char *bold_gray = "\x1b[30;1m";
    const char *reset      = "\x1b[0m";
    int offset = 0;
    while(1)
    {
        //print line
        printf("#%07x: ", offset);

        int char_covered = 0;

        //print hex groups (8)
        for(int i=0; i<8; ++i) {

            //print doublet
            for(int j=0; j<2; ++j) {
                int loffset = offset + 2*i + j;
                if(loffset >= (int)len)
                    goto escape;

                //print hex
                {
                    //start highlight
                    if(mask && mask[loffset]){printf("%s", bold_gray);}

                    //print chars
                    printf("%02x", 0xff&data[loffset]);

                    //end highlight
                    if(mask && mask[loffset]){printf("%s", reset);}
                    char_covered += 2;
                }
            }
            printf(" ");
            char_covered += 1;
        }
escape:

        //print filler if needed
        for(int i=char_covered; i<41; ++i)
            printf(" ");

        //print ascii (16)
        for(int i=0; i<16; ++i) {
            if(isprint(data[offset+i]))
                printf("%c", data[offset+i]);
            else
                printf(".");
        }
        printf("\n");
        offset += 16;
        if(offset >= (int)len)
            return;
    }
}